

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O2

base_learner * cb_explore_setup(options_i *options,vw *all)

{
  int iVar1;
  option_group_definition *poVar2;
  typed_option<float> *ptVar3;
  base_learner *l;
  single_learner *base;
  single_learner *psVar4;
  learner<CB_EXPLORE::cb_explore,_example> *plVar5;
  code *pcVar6;
  code *pcVar7;
  size_t ws;
  ulong length;
  bool bVar8;
  free_ptr<CB_EXPLORE::cb_explore> data;
  allocator local_6b4;
  allocator local_6b3;
  allocator local_6b2;
  allocator local_6b1;
  allocator local_6b0;
  allocator local_6af;
  allocator local_6ae;
  allocator local_6ad;
  allocator local_6ac;
  allocator local_6ab;
  allocator local_6aa;
  allocator local_6a9;
  string local_6a8 [32];
  string local_688;
  string local_668 [32];
  string local_648;
  string local_628 [32];
  string local_608;
  string local_5e8 [32];
  string local_5c8;
  string local_5a8 [32];
  string local_588;
  string local_568 [32];
  string local_548;
  string local_528;
  undefined1 local_508 [112];
  bool local_498;
  option_group_definition new_options;
  stringstream ss;
  undefined1 local_420 [32];
  string local_400 [64];
  bool local_3c0;
  typed_option<float> local_2a8;
  undefined1 local_208 [112];
  bool local_198;
  undefined1 local_168 [112];
  bool local_f8;
  typed_option<float> local_c8;
  
  scoped_calloc_or_throw<CB_EXPLORE::cb_explore>();
  std::__cxx11::string::string
            ((string *)&local_528,"Contextual Bandit Exploration",(allocator *)&ss);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_528);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::string((string *)&local_548,"cb_explore",&local_6a9);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)&ss,&local_548,
             &((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cbcs).
              num_actions);
  local_3c0 = true;
  std::__cxx11::string::string
            (local_568,"Online explore-exploit for a <k> action contextual bandit problem",
             &local_6aa);
  std::__cxx11::string::_M_assign(local_400);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (&new_options,(typed_option<unsigned_int> *)&ss);
  std::__cxx11::string::string((string *)&local_588,"first",&local_6ab);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_508,&local_588,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->tau);
  local_498 = true;
  std::__cxx11::string::string(local_5a8,"tau-first exploration",&local_6ac);
  std::__cxx11::string::_M_assign((string *)(local_508 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar2,(typed_option<unsigned_long> *)local_508);
  std::__cxx11::string::string((string *)&local_5c8,"epsilon",&local_6ad);
  VW::config::typed_option<float>::typed_option
            (&local_2a8,&local_5c8,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->epsilon);
  local_2a8.super_base_option.m_keep = true;
  ptVar3 = VW::config::typed_option<float>::default_value(&local_2a8,0.05);
  std::__cxx11::string::string(local_5e8,"epsilon-greedy exploration",&local_6ae);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar2,ptVar3)
  ;
  std::__cxx11::string::string((string *)&local_608,"bag",&local_6af);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_208,&local_608,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->bag_size);
  local_198 = true;
  std::__cxx11::string::string(local_628,"bagging-based exploration",&local_6b0);
  std::__cxx11::string::_M_assign((string *)(local_208 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar2,(typed_option<unsigned_long> *)local_208);
  std::__cxx11::string::string((string *)&local_648,"cover",&local_6b1);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_168,&local_648,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cover_size);
  local_f8 = true;
  std::__cxx11::string::string(local_668,"Online cover based exploration",&local_6b2);
  std::__cxx11::string::_M_assign((string *)(local_168 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar2,(typed_option<unsigned_long> *)local_168);
  std::__cxx11::string::string((string *)&local_688,"psi",&local_6b3);
  VW::config::typed_option<float>::typed_option
            (&local_c8,&local_688,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->psi);
  local_c8.super_base_option.m_keep = true;
  ptVar3 = VW::config::typed_option<float>::default_value(&local_c8,1.0);
  std::__cxx11::string::string(local_6a8,"disagreement parameter for cover",&local_6b4);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar2,ptVar3);
  std::__cxx11::string::~string(local_6a8);
  VW::config::typed_option<float>::~typed_option(&local_c8);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string(local_668);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_168);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string(local_628);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_208);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string(local_5e8);
  VW::config::typed_option<float>::~typed_option(&local_2a8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string(local_5a8);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_508);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string(local_568);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)&ss);
  std::__cxx11::string::~string((string *)&local_548);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)&ss,"cb_explore",(allocator *)local_508);
  iVar1 = (*options->_vptr_options_i[1])(options,&ss);
  std::__cxx11::string::~string((string *)&ss);
  if ((char)iVar1 == '\0') {
    plVar5 = (learner<CB_EXPLORE::cb_explore,_example> *)0x0;
    goto LAB_001f4014;
  }
  (data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
   super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->all = all;
  length = (ulong)((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
                    super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cbcs).
                  num_actions;
  std::__cxx11::string::string((string *)&ss,"cb",(allocator *)local_508);
  iVar1 = (*options->_vptr_options_i[1])(options,&ss);
  std::__cxx11::string::~string((string *)&ss);
  if ((char)iVar1 == '\0') {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::_M_insert<unsigned_long>((ulong)local_420);
    std::__cxx11::string::string((string *)local_508,"cb",(allocator *)local_208);
    std::__cxx11::stringbuf::str();
    (*options->_vptr_options_i[5])(options,local_508,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)local_508);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  all->delete_prediction = ACTION_SCORE::delete_action_scores;
  ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
    super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cbcs).cb_type = 0;
  l = setup_base(options,all);
  base = LEARNER::as_singleline<char,char>(l);
  ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
    super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cbcs).scorer = all->scorer
  ;
  std::__cxx11::string::string((string *)&ss,"cover",(allocator *)local_508);
  iVar1 = (*options->_vptr_options_i[1])(options,&ss);
  std::__cxx11::string::~string((string *)&ss);
  if ((char)iVar1 == '\0') {
    std::__cxx11::string::string((string *)&ss,"bag",(allocator *)local_508);
    iVar1 = (*options->_vptr_options_i[1])(options,&ss);
    std::__cxx11::string::~string((string *)&ss);
    if ((char)iVar1 != '\0') {
      ws = (data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
            super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->bag_size;
      pcVar6 = CB_EXPLORE::predict_or_learn_bag<false>;
      pcVar7 = CB_EXPLORE::predict_or_learn_bag<true>;
      goto LAB_001f3f53;
    }
    std::__cxx11::string::string((string *)&ss,"first",(allocator *)local_508);
    iVar1 = (*options->_vptr_options_i[1])(options,&ss);
    std::__cxx11::string::~string((string *)&ss);
    pcVar6 = CB_EXPLORE::predict_or_learn_greedy<true>;
    bVar8 = (char)iVar1 != '\0';
    if (bVar8) {
      pcVar6 = CB_EXPLORE::predict_or_learn_first<true>;
    }
    pcVar7 = CB_EXPLORE::predict_or_learn_greedy<false>;
    if (bVar8) {
      pcVar7 = CB_EXPLORE::predict_or_learn_first<false>;
    }
    plVar5 = LEARNER::learner<CB_EXPLORE::cb_explore,example>::
             init_learner<LEARNER::learner<char,example>>
                       (data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>.
                        _M_t.super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl,base,
                        pcVar6,pcVar7,1,action_probs);
  }
  else {
    psVar4 = LEARNER::as_singleline<char,char>(all->cost_sensitive);
    (data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cs =
         (learner<CB_EXPLORE::cb_explore,_example> *)psVar4;
    v_array<COST_SENSITIVE::wclass>::resize
              (&((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->
                second_cs_label).costs,length);
    ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->second_cs_label).costs.
    _end = ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
             super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->second_cs_label).
           costs._begin + length;
    ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cover_probs)._begin =
         (float *)0x0;
    ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cover_probs)._end =
         (float *)0x0;
    ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cover_probs).end_array =
         (float *)0x0;
    ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cover_probs).erase_count
         = 0;
    v_array<float>::resize
              (&(data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cover_probs,
               length);
    ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->preds).end_array =
         (uint *)0x0;
    ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->preds).erase_count = 0;
    ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->preds)._begin =
         (uint *)0x0;
    ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->preds)._end =
         (uint *)0x0;
    v_array<unsigned_int>::resize
              (&(data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->preds,
               (data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cover_size);
    ws = (data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cover_size + 1;
    pcVar6 = CB_EXPLORE::predict_or_learn_cover<false>;
    pcVar7 = CB_EXPLORE::predict_or_learn_cover<true>;
LAB_001f3f53:
    plVar5 = LEARNER::learner<CB_EXPLORE::cb_explore,example>::
             init_learner<LEARNER::learner<char,example>>
                       (data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>.
                        _M_t.super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl,base,
                        pcVar7,pcVar6,ws,action_probs);
  }
  data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
  super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl = (cb_explore *)0x0;
  *(undefined8 *)(plVar5 + 0xb8) = *(undefined8 *)(plVar5 + 0x18);
  *(undefined8 *)(plVar5 + 0xc0) = *(undefined8 *)(plVar5 + 0x20);
  *(code **)(plVar5 + 200) = CB_EXPLORE::finish;
  *(undefined8 *)(plVar5 + 0x58) = *(undefined8 *)(plVar5 + 0x18);
  *(code **)(plVar5 + 0x68) = CB_EXPLORE::finish_example;
LAB_001f4014:
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar5;
}

Assistant:

base_learner* cb_explore_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cb_explore>();
  option_group_definition new_options("Contextual Bandit Exploration");
  new_options
      .add(make_option("cb_explore", data->cbcs.num_actions)
               .keep()
               .help("Online explore-exploit for a <k> action contextual bandit problem"))
      .add(make_option("first", data->tau).keep().help("tau-first exploration"))
      .add(make_option("epsilon", data->epsilon).keep().default_value(0.05f).help("epsilon-greedy exploration"))
      .add(make_option("bag", data->bag_size).keep().help("bagging-based exploration"))
      .add(make_option("cover", data->cover_size).keep().help("Online cover based exploration"))
      .add(make_option("psi", data->psi).keep().default_value(1.0f).help("disagreement parameter for cover"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cb_explore"))
    return nullptr;

  data->all = &all;
  uint32_t num_actions = data->cbcs.num_actions;

  if (!options.was_supplied("cb"))
  {
    stringstream ss;
    ss << data->cbcs.num_actions;
    options.insert("cb", ss.str());
  }

  all.delete_prediction = delete_action_scores;
  data->cbcs.cb_type = CB_TYPE_DR;

  single_learner* base = as_singleline(setup_base(options, all));
  data->cbcs.scorer = all.scorer;

  learner<cb_explore, example>* l;
  if (options.was_supplied("cover"))
  {
    data->cs = (learner<cb_explore, example>*)(as_singleline(all.cost_sensitive));
    data->second_cs_label.costs.resize(num_actions);
    data->second_cs_label.costs.end() = data->second_cs_label.costs.begin() + num_actions;
    data->cover_probs = v_init<float>();
    data->cover_probs.resize(num_actions);
    data->preds = v_init<uint32_t>();
    data->preds.resize(data->cover_size);
    l = &init_learner(data, base, predict_or_learn_cover<true>, predict_or_learn_cover<false>, data->cover_size + 1,
        prediction_type::action_probs);
  }
  else if (options.was_supplied("bag"))
    l = &init_learner(data, base, predict_or_learn_bag<true>, predict_or_learn_bag<false>, data->bag_size,
        prediction_type::action_probs);
  else if (options.was_supplied("first"))
    l = &init_learner(
        data, base, predict_or_learn_first<true>, predict_or_learn_first<false>, 1, prediction_type::action_probs);
  else  // greedy
    l = &init_learner(
        data, base, predict_or_learn_greedy<true>, predict_or_learn_greedy<false>, 1, prediction_type::action_probs);

  l->set_finish(finish);
  l->set_finish_example(finish_example);
  return make_base(*l);
}